

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar2;
  string *psVar3;
  ulong uVar4;
  copyable *pcVar5;
  int iVar6;
  allocator local_102;
  allocator local_101;
  value cfg;
  value local_f8;
  service srv;
  value local_d0 [4];
  test_app app;
  allocator local_5a;
  allocator local_59;
  value local_58 [4];
  string type;
  
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  if (argc == 3) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::string::assign((char *)&type);
    bVar1 = std::operator!=(__lhs,"--separate");
    if (bVar1) {
      bVar1 = std::operator!=(&type,"--shared");
      if (bVar1) goto LAB_0010ccb6;
    }
    bVar1 = std::operator==(&type,"--separate");
    cppcms::json::value::copyable::copyable(&cfg.d);
    cppcms::json::value::value<char[3]>(local_d0,(char (*) [3])"./");
    std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
    psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
    std::__cxx11::string::string((string *)&srv,"paths",(allocator *)&local_f8);
    uVar4 = cppcms::json::value::operator[](psVar3);
    pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
    cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
    std::__cxx11::string::~string((string *)&srv);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::copyable::~copyable(&local_d0[0].d);
    cppcms::json::value::value<char[12]>(local_d0,(char (*) [12])"en_US.UTF-8");
    std::__cxx11::string::string((string *)&app,"localization",(allocator *)local_58);
    psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
    std::__cxx11::string::string((string *)&srv,"locales",(allocator *)&local_f8);
    uVar4 = cppcms::json::value::operator[](psVar3);
    pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
    cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
    std::__cxx11::string::~string((string *)&srv);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::copyable::~copyable(&local_d0[0].d);
    std::__cxx11::string::string((string *)&app,argv[2],&local_102);
    cppcms::json::value::value<std::__cxx11::string>
              (&local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&app);
    std::__cxx11::string::string((string *)&srv,"localization",&local_101);
    psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
    std::__cxx11::string::string((string *)local_d0,"messages",&local_59);
    psVar3 = (string *)cppcms::json::value::operator[](psVar3);
    std::__cxx11::string::string((string *)local_58,"paths",&local_5a);
    uVar4 = cppcms::json::value::operator[](psVar3);
    pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
    cppcms::json::value::copyable::operator=(pcVar5,&local_f8.d);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)&srv);
    cppcms::json::value::copyable::~copyable(&local_f8.d);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::value<char[5]>(local_58,(char (*) [5])0x11611c);
    std::__cxx11::string::string((string *)&app,"localization",(allocator *)&local_f8);
    psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
    std::__cxx11::string::string((string *)&srv,"messages",&local_102);
    psVar3 = (string *)cppcms::json::value::operator[](psVar3);
    std::__cxx11::string::string((string *)local_d0,"domains",&local_101);
    uVar4 = cppcms::json::value::operator[](psVar3);
    pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
    cppcms::json::value::copyable::operator=(pcVar5,&local_58[0].d);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)&srv);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::copyable::~copyable(&local_58[0].d);
    cppcms::json::value::value<char[8]>(local_58,(char (*) [8])0x1150f5);
    std::__cxx11::string::string((string *)&app,"localization",(allocator *)&local_f8);
    psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
    std::__cxx11::string::string((string *)&srv,"messages",&local_102);
    psVar3 = (string *)cppcms::json::value::operator[](psVar3);
    std::__cxx11::string::string((string *)local_d0,"domains",&local_101);
    uVar4 = cppcms::json::value::operator[](psVar3);
    pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
    cppcms::json::value::copyable::operator=(pcVar5,&local_58[0].d);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)&srv);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::copyable::~copyable(&local_58[0].d);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Using separate header/body");
      std::endl<char,std::char_traits<char>>(poVar2);
      cppcms::json::value::value<char[14]>(local_d0,(char (*) [14])"tc_sep_skin_a");
      std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
      std::__cxx11::string::string((string *)&srv,"skins",(allocator *)&local_f8);
      uVar4 = cppcms::json::value::operator[](psVar3);
      pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
      cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
      std::__cxx11::string::~string((string *)&srv);
      std::__cxx11::string::~string((string *)&app);
      cppcms::json::value::copyable::~copyable(&local_d0[0].d);
      cppcms::json::value::value<char[14]>(local_d0,(char (*) [14])"tc_sep_skin_b");
      std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
      std::__cxx11::string::string((string *)&srv,"skins",(allocator *)&local_f8);
      uVar4 = cppcms::json::value::operator[](psVar3);
      pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
      cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
      std::__cxx11::string::~string((string *)&srv);
      std::__cxx11::string::~string((string *)&app);
      cppcms::json::value::copyable::~copyable(&local_d0[0].d);
      cppcms::json::value::value<char[12]>(local_d0,(char (*) [12])"tc_sep_skin");
      std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
      std::__cxx11::string::string((string *)&srv,"skins",(allocator *)&local_f8);
      uVar4 = cppcms::json::value::operator[](psVar3);
      pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
      cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
      std::__cxx11::string::~string((string *)&srv);
      std::__cxx11::string::~string((string *)&app);
      cppcms::json::value::copyable::~copyable(&local_d0[0].d);
      cppcms::json::value::value<char[10]>(local_d0,(char (*) [10])"tc_plugin");
      std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
      std::__cxx11::string::string((string *)&srv,"skins",(allocator *)&local_f8);
      uVar4 = cppcms::json::value::operator[](psVar3);
      pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
      cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
      std::__cxx11::string::~string((string *)&srv);
      std::__cxx11::string::~string((string *)&app);
      cppcms::json::value::copyable::~copyable(&local_d0[0].d);
      cppcms::json::value::value<char[11]>(local_d0,(char (*) [11])"tc_plugin2");
      std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
      std::__cxx11::string::string((string *)&srv,"skins",(allocator *)&local_f8);
      uVar4 = cppcms::json::value::operator[](psVar3);
      pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
      cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Using shared header/body");
      std::endl<char,std::char_traits<char>>(poVar2);
      cppcms::json::value::value<char[10]>(local_d0,(char (*) [10])"tc_skin_a");
      std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
      std::__cxx11::string::string((string *)&srv,"skins",(allocator *)&local_f8);
      uVar4 = cppcms::json::value::operator[](psVar3);
      pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
      cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
      std::__cxx11::string::~string((string *)&srv);
      std::__cxx11::string::~string((string *)&app);
      cppcms::json::value::copyable::~copyable(&local_d0[0].d);
      cppcms::json::value::value<char[10]>(local_d0,(char (*) [10])"tc_skin_b");
      std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
      std::__cxx11::string::string((string *)&srv,"skins",(allocator *)&local_f8);
      uVar4 = cppcms::json::value::operator[](psVar3);
      pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
      cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
      std::__cxx11::string::~string((string *)&srv);
      std::__cxx11::string::~string((string *)&app);
      cppcms::json::value::copyable::~copyable(&local_d0[0].d);
      cppcms::json::value::value<char[8]>(local_d0,(char (*) [8])"tc_skin");
      std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
      std::__cxx11::string::string((string *)&srv,"skins",(allocator *)&local_f8);
      uVar4 = cppcms::json::value::operator[](psVar3);
      pcVar5 = (copyable *)cppcms::json::value::operator[](uVar4);
      cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
    }
    std::__cxx11::string::~string((string *)&srv);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::copyable::~copyable(&local_d0[0].d);
    cppcms::json::value::value<char[8]>(local_d0,(char (*) [8])"tc_skin");
    std::__cxx11::string::string((string *)&app,"views",(allocator *)local_58);
    psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
    std::__cxx11::string::string((string *)&srv,"default_skin",(allocator *)&local_f8);
    pcVar5 = (copyable *)cppcms::json::value::operator[](psVar3);
    cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
    std::__cxx11::string::~string((string *)&srv);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::copyable::~copyable(&local_d0[0].d);
    cppcms::json::value::value<char[14]>(local_d0,(char (*) [14])"thread_shared");
    std::__cxx11::string::string((string *)&app,"cache",(allocator *)local_58);
    psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
    std::__cxx11::string::string((string *)&srv,"backend",(allocator *)&local_f8);
    pcVar5 = (copyable *)cppcms::json::value::operator[](psVar3);
    cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
    std::__cxx11::string::~string((string *)&srv);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::copyable::~copyable(&local_d0[0].d);
    local_58[0].d = (copyable)0x64;
    local_58[0]._1_3_ = 0;
    cppcms::json::value::value<int>(local_d0,(int *)local_58);
    std::__cxx11::string::string((string *)&app,"cache",(allocator *)&local_f8);
    psVar3 = (string *)cppcms::json::value::operator[]((string *)&cfg);
    std::__cxx11::string::string((string *)&srv,"limit",&local_102);
    pcVar5 = (copyable *)cppcms::json::value::operator[](psVar3);
    cppcms::json::value::copyable::operator=(pcVar5,&local_d0[0].d);
    std::__cxx11::string::~string((string *)&srv);
    std::__cxx11::string::~string((string *)&app);
    cppcms::json::value::copyable::~copyable(&local_d0[0].d);
    cppcms::service::service(&srv,&cfg);
    test_app::test_app(&app,&srv);
    test_app::test_buffer(&app);
    test_app::set_context(&app);
    test_app::test_skins(&app);
    test_app::test_views(&app);
    test_app::test_templates(&app);
    test_app::test_if(&app);
    test_app::test_url(&app);
    test_app::test_foreach(&app);
    test_app::test_format(&app);
    test_app::test_forms(&app);
    test_app::test_block_filter(&app);
    test_app::test_cache(&app);
    test_app::test_using_render(&app);
    test_app::test_gettext(&app);
    if (bVar1) {
      test_app::test_using_from(&app);
      test_app::test_domain(&app);
    }
    test_app::~test_app(&app);
    cppcms::service::~service(&srv);
    cppcms::json::value::copyable::~copyable(&cfg.d);
    poVar2 = std::operator<<((ostream *)&std::cout,"Ok");
    iVar6 = 0;
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
LAB_0010ccb6:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage (--separate|--shared) /path/to/tests/dir")
    ;
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar6 = 1;
  }
  std::__cxx11::string::~string((string *)&type);
  return iVar6;
}

Assistant:

int main(int argc,char **argv)
{
	std::string type;
	if(argc!=3 || ((type=argv[1])!="--separate" && type!="--shared")) {
		std::cerr << "Usage (--separate|--shared) /path/to/tests/dir" << std::endl;
		return 1;
	}
	bool separate = type == "--separate";
	try {
		cppcms::json::value cfg;
		cfg["views"]["paths"][0]="./";
		cfg["localization"]["locales"][0]="en_US.UTF-8";
		cfg["localization"]["messages"]["paths"][0]=std::string(argv[2]);
		cfg["localization"]["messages"]["domains"][0]="main";
		cfg["localization"]["messages"]["domains"][1]="plugin2";

		if(separate) {
			std::cout << "Using separate header/body" << std::endl;
			cfg["views"]["skins"][0]="tc_sep_skin_a";
			cfg["views"]["skins"][1]="tc_sep_skin_b";
			cfg["views"]["skins"][2]="tc_sep_skin";
			cfg["views"]["skins"][3]="tc_plugin";
			cfg["views"]["skins"][4]="tc_plugin2";
		}
		else {
			std::cout << "Using shared header/body" << std::endl;
			cfg["views"]["skins"][0]="tc_skin_a";
			cfg["views"]["skins"][1]="tc_skin_b";
			cfg["views"]["skins"][2]="tc_skin";
		}
		cfg["views"]["default_skin"]="tc_skin";
		cfg["cache"]["backend"]="thread_shared";
		cfg["cache"]["limit"]=100;
		cppcms::service srv(cfg);
		test_app app(srv);

		app.test_buffer();

		app.set_context();

		app.test_skins();
		app.test_views();
		app.test_templates();
		app.test_if();
		app.test_url();
		app.test_foreach();
		app.test_format();
		app.test_forms();
		app.test_block_filter();
		app.test_cache();
		app.test_using_render();
		app.test_gettext();
		if(separate) {
			app.test_using_from();
			app.test_domain();
		}
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}